

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O3

sunrealtype LBasisD2(ARKInterp I,int j,sunrealtype t)

{
  double dVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  sunrealtype sVar9;
  double dVar10;
  double dVar11;
  
  pvVar2 = I->content;
  uVar3 = (ulong)*(int *)((long)pvVar2 + 0x18);
  if ((long)uVar3 < 1) {
    sVar9 = 0.0;
  }
  else {
    lVar4 = (long)j;
    uVar5 = (ulong)(uint)j;
    sVar9 = 0.0;
    uVar6 = 0;
    do {
      if (uVar6 != uVar5) {
        dVar10 = 0.0;
        uVar7 = 0;
        do {
          if (uVar7 != uVar6 && uVar7 != uVar5) {
            uVar8 = 0;
            dVar11 = 1.0;
            do {
              if (((uVar6 != uVar8) && (uVar5 != uVar8)) && (uVar7 != uVar8)) {
                dVar1 = *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar8 * 8);
                dVar11 = dVar11 * ((t - dVar1) /
                                  (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8) - dVar1))
                ;
              }
              uVar8 = uVar8 + 1;
            } while (uVar3 != uVar8);
            dVar10 = dVar10 + dVar11 / (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8) -
                                       *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar7 * 8));
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar3);
        sVar9 = sVar9 + dVar10 / (*(double *)(*(long *)((long)pvVar2 + 0x10) + lVar4 * 8) -
                                 *(double *)(*(long *)((long)pvVar2 + 0x10) + uVar6 * 8));
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar3);
  }
  return sVar9;
}

Assistant:

sunrealtype LBasisD2(ARKInterp I, int j, sunrealtype t)
{
  int i, k, l;
  sunrealtype p, q, r;
  p = ZERO;
  for (l = 0; l < LINT_NHIST(I); l++)
  {
    if (l == j) { continue; }
    q = ZERO;
    for (i = 0; i < LINT_NHIST(I); i++)
    {
      if (i == j) { continue; }
      if (i == l) { continue; }
      r = ONE;
      for (k = 0; k < LINT_NHIST(I); k++)
      {
        if (k == j) { continue; }
        if (k == i) { continue; }
        if (k == l) { continue; }
        r *= (t - LINT_TJ(I, k)) / (LINT_TJ(I, j) - LINT_TJ(I, k));
      }
      q += r / (LINT_TJ(I, j) - LINT_TJ(I, i));
    }
    p += q / (LINT_TJ(I, j) - LINT_TJ(I, l));
  }

  return (p);
}